

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_http_upstream_ip_hash_module.c
# Opt level: O0

ngx_int_t ngx_http_upstream_init_ip_hash_peer
                    (ngx_http_request_t *r,ngx_http_upstream_srv_conf_t *us)

{
  sa_family_t sVar1;
  void *pvVar2;
  ngx_int_t nVar3;
  ngx_http_upstream_ip_hash_peer_data_t *iphp;
  sockaddr_in6 *sin6;
  sockaddr_in *sin;
  ngx_http_upstream_srv_conf_t *us_local;
  ngx_http_request_t *r_local;
  
  pvVar2 = ngx_palloc(r->pool,0x50);
  if (pvVar2 == (void *)0x0) {
    r_local = (ngx_http_request_t *)0xffffffffffffffff;
  }
  else {
    (r->upstream->peer).data = pvVar2;
    nVar3 = ngx_http_upstream_init_round_robin_peer(r,us);
    if (nVar3 == 0) {
      (r->upstream->peer).get = ngx_http_upstream_get_ip_hash_peer;
      sVar1 = r->connection->sockaddr->sa_family;
      if (sVar1 == 2) {
        *(char **)((long)pvVar2 + 0x38) = r->connection->sockaddr->sa_data + 2;
        *(undefined1 *)((long)pvVar2 + 0x30) = 3;
      }
      else if (sVar1 == 10) {
        *(char **)((long)pvVar2 + 0x38) = r->connection->sockaddr->sa_data + 6;
        *(undefined1 *)((long)pvVar2 + 0x30) = 0x10;
      }
      else {
        *(u_char **)((long)pvVar2 + 0x38) = ngx_http_upstream_ip_hash_pseudo_addr;
        *(undefined1 *)((long)pvVar2 + 0x30) = 3;
      }
      *(undefined8 *)((long)pvVar2 + 0x28) = 0x59;
      *(undefined1 *)((long)pvVar2 + 0x40) = 0;
      *(code **)((long)pvVar2 + 0x48) = ngx_http_upstream_get_round_robin_peer;
      r_local = (ngx_http_request_t *)0x0;
    }
    else {
      r_local = (ngx_http_request_t *)0xffffffffffffffff;
    }
  }
  return (ngx_int_t)r_local;
}

Assistant:

static ngx_int_t
ngx_http_upstream_init_ip_hash_peer(ngx_http_request_t *r,
    ngx_http_upstream_srv_conf_t *us)
{
    struct sockaddr_in                     *sin;
#if (NGX_HAVE_INET6)
    struct sockaddr_in6                    *sin6;
#endif
    ngx_http_upstream_ip_hash_peer_data_t  *iphp;

    iphp = ngx_palloc(r->pool, sizeof(ngx_http_upstream_ip_hash_peer_data_t));
    if (iphp == NULL) {
        return NGX_ERROR;
    }

    r->upstream->peer.data = &iphp->rrp;

    if (ngx_http_upstream_init_round_robin_peer(r, us) != NGX_OK) {
        return NGX_ERROR;
    }

    r->upstream->peer.get = ngx_http_upstream_get_ip_hash_peer;

    switch (r->connection->sockaddr->sa_family) {

    case AF_INET:
        sin = (struct sockaddr_in *) r->connection->sockaddr;
        iphp->addr = (u_char *) &sin->sin_addr.s_addr;
        iphp->addrlen = 3;
        break;

#if (NGX_HAVE_INET6)
    case AF_INET6:
        sin6 = (struct sockaddr_in6 *) r->connection->sockaddr;
        iphp->addr = (u_char *) &sin6->sin6_addr.s6_addr;
        iphp->addrlen = 16;
        break;
#endif

    default:
        iphp->addr = ngx_http_upstream_ip_hash_pseudo_addr;
        iphp->addrlen = 3;
    }

    iphp->hash = 89;
    iphp->tries = 0;
    iphp->get_rr_peer = ngx_http_upstream_get_round_robin_peer;

    return NGX_OK;
}